

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O1

bool __thiscall
google::protobuf::MessageLite::
ParseFrom<(google::protobuf::MessageLite::ParseFlags)0,std::basic_string_view<char,std::char_traits<char>>>
          (MessageLite *this,basic_string_view<char,_std::char_traits<char>_> *input)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  MessageLite *msg;
  ParseFlags in_R9D;
  string_view input_00;
  MessageLite local_30;
  MessageLite *local_20;
  
  iVar2 = (*this->_vptr_MessageLite[4])();
  if (CONCAT44(extraout_var,iVar2) == 0) {
    ParseFrom<(google::protobuf::MessageLite::ParseFlags)0,std::basic_string_view<char,std::char_traits<char>>>
              (&local_30);
  }
  else {
    msg = *(MessageLite **)(CONCAT44(extraout_var,iVar2) + 8);
    if (msg != (MessageLite *)0x0) goto LAB_002fa441;
  }
  ParseFrom<(google::protobuf::MessageLite::ParseFlags)0,std::basic_string_view<char,std::char_traits<char>>>
            ();
  msg = local_20;
LAB_002fa441:
  input_00._M_str = (char *)this;
  input_00._M_len = (size_t)input->_M_str;
  bVar1 = internal::MergeFromImpl<false>
                    ((internal *)input->_M_len,input_00,msg,(TcParseTableBase *)0x0,in_R9D);
  return bVar1;
}

Assistant:

bool MessageLite::ParseFrom(const T& input) {
  if (flags & kParse) Clear();
  constexpr bool alias = (flags & kMergeWithAliasing) != 0;
  const internal::TcParseTableBase* tc_table;
  PROTOBUF_ALWAYS_INLINE_CALL tc_table = GetTcParseTable();
  return internal::MergeFromImpl<alias>(input, this, tc_table, flags);
}